

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O3

void __thiscall
Js::JavascriptPromiseResolveOrRejectFunction::JavascriptPromiseResolveOrRejectFunction
          (JavascriptPromiseResolveOrRejectFunction *this,DynamicType *type,
          FunctionInfo *functionInfo,JavascriptPromise *promise,bool isReject,
          JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *alreadyResolvedRecord)

{
  RuntimeFunction::RuntimeFunction(&this->super_RuntimeFunction,type,functionInfo);
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_0152d538;
  Memory::Recycler::WBSetBit((char *)&this->promise);
  (this->promise).ptr = promise;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->promise);
  this->isReject = isReject;
  Memory::Recycler::WBSetBit((char *)&this->alreadyResolvedWrapper);
  (this->alreadyResolvedWrapper).ptr = alreadyResolvedRecord;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->alreadyResolvedWrapper);
  return;
}

Assistant:

JavascriptPromiseResolveOrRejectFunction::JavascriptPromiseResolveOrRejectFunction(DynamicType* type, FunctionInfo* functionInfo, JavascriptPromise* promise, bool isReject, JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyResolvedRecord)
        : RuntimeFunction(type, functionInfo), promise(promise), isReject(isReject), alreadyResolvedWrapper(alreadyResolvedRecord)
    { }